

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O0

void __thiscall EDLines::ValidateLineSegments(EDLines *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  ulong uVar8;
  int *x_00;
  int *y_00;
  reference pvVar9;
  reference this_00;
  reference pvVar10;
  reference __dest;
  double dVar11;
  double diff;
  double pixelAngle;
  int gy;
  int gx;
  int com2;
  int com1;
  int c;
  int r;
  int j;
  int count;
  int aligned;
  bool valid;
  int noPixels;
  Point *pixels;
  double lineAngle;
  LineSegment *ls;
  int i;
  int eraseOffset;
  int noValidLines;
  int *y;
  int *x;
  EDLines *this_local;
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(((this->super_ED).width + (this->super_ED).height) * 4);
  uVar8 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  x_00 = (int *)operator_new__(uVar8);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)(((this->super_ED).width + (this->super_ED).height) * 4);
  uVar8 = SUB168(auVar5 * ZEXT816(4),0);
  if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  y_00 = (int *)operator_new__(uVar8);
  i = 0;
  for (ls._4_4_ = 0; ls._4_4_ < this->linesNo; ls._4_4_ = ls._4_4_ + 1) {
    pvVar9 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                       (&this->lines,(long)ls._4_4_);
    if (pvVar9->invert == 0) {
      pixels = (Point *)atan(pvVar9->b);
    }
    else {
      pixels = (Point *)atan(1.0 / pvVar9->b);
    }
    if ((double)pixels < 0.0) {
      pixels = (Point *)((double)pixels + 3.141592653589793);
    }
    this_00 = std::
              vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ::operator[](&(this->super_ED).segmentPoints,(long)pvVar9->segmentNo);
    pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[](this_00,0)
    ;
    iVar1 = pvVar9->len;
    if (pvVar9->len < 0x50) {
      if (pvVar9->len < 0x1a) {
        count._3_1_ = ValidateLineSegmentRect(this,x_00,y_00,pvVar9);
      }
      else {
        j = 0;
        r = 0;
        for (c = 0; c < iVar1; c = c + 1) {
          iVar2 = pvVar10[c].x;
          iVar3 = pvVar10[c].y;
          if ((((0 < iVar2) && (iVar2 < (this->super_ED).height + -1)) && (0 < iVar3)) &&
             (iVar3 < (this->super_ED).width + -1)) {
            r = r + 1;
            iVar6 = (uint)(this->super_ED).srcImg[(iVar2 + 1) * (this->super_ED).width + iVar3 + 1]
                    - (uint)(this->super_ED).srcImg
                            [(iVar2 + -1) * (this->super_ED).width + iVar3 + -1];
            iVar7 = (uint)(this->super_ED).srcImg[(iVar2 + -1) * (this->super_ED).width + iVar3 + 1]
                    - (uint)(this->super_ED).srcImg
                            [(iVar2 + 1) * (this->super_ED).width + iVar3 + -1];
            dVar11 = NFALUT::myAtan2((double)(int)((iVar6 + iVar7 +
                                                   (uint)(this->super_ED).srcImg
                                                         [iVar2 * (this->super_ED).width + iVar3 + 1
                                                         ]) -
                                                  (uint)(this->super_ED).srcImg
                                                        [iVar2 * (this->super_ED).width + iVar3 + -1
                                                        ]),
                                     (double)(int)-(((iVar6 - iVar7) +
                                                    (uint)(this->super_ED).srcImg
                                                          [(iVar2 + 1) * (this->super_ED).width +
                                                           iVar3]) -
                                                   (uint)(this->super_ED).srcImg
                                                         [(iVar2 + -1) * (this->super_ED).width +
                                                          iVar3]));
            if ((ABS((double)pixels - dVar11) <= this->prec) ||
               (3.141592653589793 - this->prec <= ABS((double)pixels - dVar11))) {
              j = j + 1;
            }
          }
        }
        count._3_1_ = NFALUT::checkValidationByNFA(this->nfa,r,j);
        if (!count._3_1_) {
          count._3_1_ = ValidateLineSegmentRect(this,x_00,y_00,pvVar9);
        }
      }
    }
    else {
      count._3_1_ = true;
    }
    if (count._3_1_ == false) {
      pvVar9 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                         (&this->lines,(long)ls._4_4_);
      std::vector<LineSegment,_std::allocator<LineSegment>_>::push_back(&this->invalidLines,pvVar9);
    }
    else {
      if (ls._4_4_ != i) {
        pvVar9 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                           (&this->lines,(long)ls._4_4_);
        __dest = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                           (&this->lines,(long)i);
        memcpy(__dest,pvVar9,0x44);
      }
      i = i + 1;
    }
  }
  this->linesNo = i;
  if (x_00 != (int *)0x0) {
    operator_delete(x_00);
  }
  if (y_00 != (int *)0x0) {
    operator_delete(y_00);
  }
  return;
}

Assistant:

void EDLines::ValidateLineSegments()
{

	int *x = new int[(width + height) * 4];
	int *y = new int[(width + height) * 4];

	int noValidLines = 0;
	int eraseOffset = 0;
	for (int i = 0; i< linesNo; i++) {
		LineSegment *ls = &lines[i];

		// Compute Line's angle
		double lineAngle;

		if (ls->invert == 0) {
			// y = a + bx
			lineAngle = atan(ls->b);

		}
		else {
			// x = a + by
			lineAngle = atan(1.0 / ls->b);
		} //end-else

		if (lineAngle < 0) lineAngle += M_PI;

		Point *pixels = &(segmentPoints[ls->segmentNo][0]);
		int noPixels = ls->len;

		bool valid = false;

		// Accept very long lines without testing. They are almost never invalidated.
		if (ls->len >= 80) {
			valid = true;

			// Validate short line segments by a line support region rectangle having width=2
		}
		else if (ls->len <= 25) {
			valid = ValidateLineSegmentRect( x, y, ls);

		}
		else {
			// Longer line segments are first validated by a line support region rectangle having width=1 (for speed)
			// If the line segment is still invalid, then a line support region rectangle having width=2 is tried
			// If the line segment fails both tests, it is discarded
			int aligned = 0;
			int count = 0;
			for (int j = 0; j<noPixels; j++) {
				int r = pixels[j].x;
				int c = pixels[j].y;

				if (r <= 0 || r >= height - 1 || c <= 0 || c >= width - 1) continue;

				count++;

				// compute gx & gy using the simple [-1 -1 -1]
				//                                  [ 1  1  1]  filter in both directions
				// Faster method below
				// A B C
				// D x E
				// F G H
				// gx = (C-A) + (E-D) + (H-F)
				// gy = (F-A) + (G-B) + (H-C)
				//
				// To make this faster: 
				// com1 = (H-A)
				// com2 = (C-F)
				// Then: gx = com1 + com2 + (E-D) = (H-A) + (C-F) + (E-D) = (C-A) + (E-D) + (H-F)
				//       gy = com2 - com1 + (G-B) = (H-A) - (C-F) + (G-B) = (F-A) + (G-B) + (H-C)
				// 
				int com1 = srcImg[(r + 1)*width + c + 1] - srcImg[(r - 1)*width + c - 1];
				int com2 = srcImg[(r - 1)*width + c + 1] - srcImg[(r + 1)*width + c - 1];

				int gx = com1 + com2 + srcImg[r*width + c + 1] - srcImg[r*width + c - 1];
				int gy = com1 - com2 + srcImg[(r + 1)*width + c] - srcImg[(r - 1)*width + c];
				
				double pixelAngle = nfa->myAtan2((double)gx, (double)-gy);
				double diff = fabs(lineAngle - pixelAngle);

				if (diff <= prec || diff >= M_PI - prec) aligned++;
			} //end-for

			// Check validation by NFA computation (fast due to LUT)
			valid = nfa->checkValidationByNFA(count, aligned);
			if (valid == false) valid = ValidateLineSegmentRect(x, y, ls);
		} //end-else

		if (valid) {
			if (i != noValidLines) lines[noValidLines] = lines[i];
			noValidLines++;
		}
		else {
			invalidLines.push_back(lines[i]);
		} //end-else
	} //end-for

	linesNo = noValidLines;

	delete x;
	delete y;
}